

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpRelaxation.cpp
# Opt level: O1

void __thiscall
HighsLpRelaxation::HighsLpRelaxation(HighsLpRelaxation *this,HighsLpRelaxation *other)

{
  Highs *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  string local_3f8;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *local_3d8;
  vector<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_> *local_3d0;
  HighsLp local_3c8;
  
  this->mipsolver = other->mipsolver;
  this_00 = &this->lpsolver;
  Highs::Highs(this_00);
  std::vector<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_>::vector
            (&this->lprows,&other->lprows);
  local_3d0 = &this->lprows;
  std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::vector
            (&this->fractionalints,&other->fractionalints);
  (this->row_ep).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->row_ep).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->row_ep).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  (this->row_ep).array.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->row_ep).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->row_ep).index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (this->row_ep).cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->row_ep).cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->row_ep).cwork.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->row_ep).iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->row_ep).iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (this->row_ep).iwork.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  (this->dualproofvals).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->dualproofvals).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->dualproofvals).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->dualproofinds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->dualproofinds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->dualproofinds).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->dualproofbuffer).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->dualproofbuffer).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->dualproofbuffer).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->colLbBuffer).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->colLbBuffer).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->colLbBuffer).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->colUbBuffer).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->colUbBuffer).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->colUbBuffer).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->row_ep).packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->row_ep).packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->row_ep).packIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->row_ep).packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->row_ep).packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->row_ep).packValue.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->row_ap).values.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->row_ap).values.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->row_ap).values.super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->row_ap).nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->row_ap).nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->row_ap).nonzeroinds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->objective = other->objective;
  (this->basischeckpoint).super___shared_ptr<const_HighsBasis,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (other->basischeckpoint).super___shared_ptr<const_HighsBasis,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  p_Var2 = (other->basischeckpoint).super___shared_ptr<const_HighsBasis,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (this->basischeckpoint).super___shared_ptr<const_HighsBasis,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  this->currentbasisstored = other->currentbasisstored;
  this->adjustSymBranchingCol = other->adjustSymBranchingCol;
  paVar1 = &local_3f8.field_2;
  local_3f8._M_dataplus._M_p = (pointer)paVar1;
  local_3d8 = &this->fractionalints;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"output_flag","");
  Highs::setOptionValue(this_00,&local_3f8,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_3f8._M_dataplus._M_p);
  }
  Highs::passOptions(this_00,&(other->lpsolver).options_);
  HighsLp::HighsLp(&local_3c8,&(other->lpsolver).model_.lp_);
  Highs::passModel(this_00,&local_3c8);
  HighsLp::~HighsLp(&local_3c8);
  local_3f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"");
  Highs::setBasis(this_00,&(other->lpsolver).basis_,&local_3f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_3f8._M_dataplus._M_p);
  }
  std::vector<double,_std::allocator<double>_>::resize
            (&this->colLbBuffer,(long)this->mipsolver->model_->num_col_);
  std::vector<double,_std::allocator<double>_>::resize
            (&this->colUbBuffer,(long)this->mipsolver->model_->num_col_);
  this->epochs = 0;
  this->maxNumFractional = 0;
  this->status = kNotSet;
  this->avgSolveIters = 0.0;
  this->numSolved = 0;
  this->numlpiters = 0;
  this->lastAgeCall = 0;
  this->objective = -INFINITY;
  (this->row_ep).size = 0;
  return;
}

Assistant:

HighsLpRelaxation::HighsLpRelaxation(const HighsLpRelaxation& other)
    : mipsolver(other.mipsolver),
      lprows(other.lprows),
      fractionalints(other.fractionalints),
      objective(other.objective),
      basischeckpoint(other.basischeckpoint),
      currentbasisstored(other.currentbasisstored),
      adjustSymBranchingCol(other.adjustSymBranchingCol) {
  lpsolver.setOptionValue("output_flag", false);
  lpsolver.passOptions(other.lpsolver.getOptions());
  lpsolver.passModel(other.lpsolver.getLp());
  lpsolver.setBasis(other.lpsolver.getBasis());
  colLbBuffer.resize(mipsolver.numCol());
  colUbBuffer.resize(mipsolver.numCol());
  status = Status::kNotSet;
  numlpiters = 0;
  avgSolveIters = 0;
  numSolved = 0;
  epochs = 0;
  maxNumFractional = 0;
  lastAgeCall = 0;
  objective = -kHighsInf;
  row_ep.size = 0;
}